

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack.cpp
# Opt level: O2

void __thiscall wasm::BinaryInstWriter::visitSwitch(BinaryInstWriter *this,Switch *curr)

{
  ArenaVector<wasm::Name> *pAVar1;
  U32LEB UVar2;
  BufferWithRandomAccess *pBVar3;
  Name *pNVar4;
  ulong uVar5;
  ArenaVector<wasm::Name> *__range1;
  Name name;
  Name name_00;
  undefined1 local_48 [8];
  Iterator __begin1;
  
  pBVar3 = BufferWithRandomAccess::operator<<(this->o,'\x0e');
  UVar2.value = (uint)(curr->targets).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.
                      usedElements;
  uVar5 = (ulong)UVar2.value;
  BufferWithRandomAccess::operator<<(pBVar3,UVar2);
  __begin1.parent = (ArenaVector<wasm::Name> *)0x0;
  pAVar1 = (ArenaVector<wasm::Name> *)
           (curr->targets).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.usedElements;
  local_48 = (undefined1  [8])&curr->targets;
  __begin1.index = (size_t)curr;
  while ((__begin1.parent != pAVar1 || (local_48 != (undefined1  [8])&curr->targets))) {
    pNVar4 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::Iterator::operator*
                       ((Iterator *)local_48);
    pBVar3 = this->o;
    name.super_IString.str._M_str = (pNVar4->super_IString).str._M_str;
    name.super_IString.str._M_len = uVar5;
    UVar2.value = getBreakIndex(this,name);
    uVar5 = (ulong)UVar2.value;
    BufferWithRandomAccess::operator<<(pBVar3,UVar2);
    __begin1.parent =
         (ArenaVector<wasm::Name> *)
         ((long)&((__begin1.parent)->super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>).
                 data + 1);
  }
  pBVar3 = this->o;
  name_00.super_IString.str._M_str = *(char **)(__begin1.index + 0x38);
  name_00.super_IString.str._M_len = uVar5;
  UVar2.value = getBreakIndex(this,name_00);
  BufferWithRandomAccess::operator<<(pBVar3,UVar2);
  return;
}

Assistant:

void BinaryInstWriter::visitSwitch(Switch* curr) {
  o << int8_t(BinaryConsts::BrTable) << U32LEB(curr->targets.size());
  for (auto target : curr->targets) {
    o << U32LEB(getBreakIndex(target));
  }
  o << U32LEB(getBreakIndex(curr->default_));
}